

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

Fraig_Node_t *
Fraig_NodeRecognizeMux(Fraig_Node_t *pNode,Fraig_Node_t **ppNodeT,Fraig_Node_t **ppNodeE)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Fraig_Node_t *pNode2;
  Fraig_Node_t *pNode1;
  Fraig_Node_t **ppNodeE_local;
  Fraig_Node_t **ppNodeT_local;
  Fraig_Node_t *pNode_local;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigUtil.c"
                  ,0x295,
                  "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
                 );
  }
  iVar1 = Fraig_NodeIsMuxType(pNode);
  if (iVar1 != 0) {
    uVar2 = (ulong)pNode->p1 & 0xfffffffffffffffe;
    uVar3 = (ulong)pNode->p2 & 0xfffffffffffffffe;
    if (*(ulong *)(uVar2 + 0x20) == (*(ulong *)(uVar3 + 0x20) ^ 1)) {
      if ((*(ulong *)(uVar2 + 0x20) & 1) == 0) {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x28) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x28) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar2 + 0x20);
      }
      else {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x28) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x28) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar3 + 0x20);
      }
    }
    else if (*(ulong *)(uVar2 + 0x20) == (*(ulong *)(uVar3 + 0x28) ^ 1)) {
      if ((*(ulong *)(uVar2 + 0x20) & 1) == 0) {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x28) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x20) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar2 + 0x20);
      }
      else {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x20) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x28) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar3 + 0x28);
      }
    }
    else if (*(ulong *)(uVar2 + 0x28) == (*(ulong *)(uVar3 + 0x20) ^ 1)) {
      if ((*(ulong *)(uVar2 + 0x28) & 1) == 0) {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x20) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x28) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar2 + 0x28);
      }
      else {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x28) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x20) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar3 + 0x20);
      }
    }
    else {
      if (*(ulong *)(uVar2 + 0x28) != (*(ulong *)(uVar3 + 0x28) ^ 1)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigUtil.c"
                      ,0x2d7,
                      "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
                     );
      }
      if ((*(ulong *)(uVar2 + 0x28) & 1) == 0) {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x20) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x20) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar2 + 0x28);
      }
      else {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar3 + 0x20) ^ 1);
        *ppNodeE = (Fraig_Node_t *)(*(ulong *)(uVar2 + 0x20) ^ 1);
        pNode_local = *(Fraig_Node_t **)(uVar3 + 0x28);
      }
    }
    return pNode_local;
  }
  __assert_fail("Fraig_NodeIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigUtil.c"
                ,0x296,
                "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
               );
}

Assistant:

Fraig_Node_t * Fraig_NodeRecognizeMux( Fraig_Node_t * pNode, Fraig_Node_t ** ppNodeT, Fraig_Node_t ** ppNodeE )
{
    Fraig_Node_t * pNode1, * pNode2;
    assert( !Fraig_IsComplement(pNode) );
    assert( Fraig_NodeIsMuxType(pNode) );
    // get children
    pNode1 = Fraig_Regular(pNode->p1);
    pNode2 = Fraig_Regular(pNode->p2);
    // find the control variable
    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    {
        if ( Fraig_IsComplement(pNode1->p1) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p2);
            *ppNodeE = Fraig_Not(pNode1->p2);
            return pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p2);
            *ppNodeE = Fraig_Not(pNode2->p2);
            return pNode1->p1;
        }
    }
    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    {
        if ( Fraig_IsComplement(pNode1->p1) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p1);
            *ppNodeE = Fraig_Not(pNode1->p2);
            return pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p2);
            *ppNodeE = Fraig_Not(pNode2->p1);
            return pNode1->p1;
        }
    }
    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    {
        if ( Fraig_IsComplement(pNode1->p2) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p2);
            *ppNodeE = Fraig_Not(pNode1->p1);
            return pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p1);
            *ppNodeE = Fraig_Not(pNode2->p2);
            return pNode1->p2;
        }
    }
    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    {
        if ( Fraig_IsComplement(pNode1->p2) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p1);
            *ppNodeE = Fraig_Not(pNode1->p1);
            return pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p1);
            *ppNodeE = Fraig_Not(pNode2->p1);
            return pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}